

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  double dVar5;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ChargeType charge;
  MassType mass;
  PositionType position;
  AssertHelper local_c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined1 local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  double local_58 [4];
  undefined1 *local_38;
  
  local_38 = &DAT_c028ae147ae147ae;
  local_58[0] = 3254.23;
  local_58[1] = -123.324;
  local_58[2] = 123000.0;
  local_60 = &DAT_3a520b016873bbd3;
  local_68 = &DAT_be0080f172b1f37d;
  local_88 = *pica::ParticleTypes::types;
  dStack_80 = 0.0;
  local_b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_c028ae147ae147ae;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_a8,"position[d]","particle.getPosition()[d]",(double *)&local_38,
             (double *)&local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (sStack_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)sStack_a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (((local_b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_b8.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    dVar5 = local_88 * 29979245800.0;
    auVar4._8_4_ = SUB84(dVar5,0);
    auVar4._0_8_ = dVar5;
    auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
    auVar4 = divpd(_DAT_001c7460,auVar4);
    local_88 = auVar4._0_8_ * 29979245800.0;
    dStack_80 = auVar4._8_8_ * 29979245800.0;
    local_70 = (123000.0 / dVar5) * 29979245800.0;
    lVar2 = 0;
    do {
      dVar5 = *pica::ParticleTypes::types;
      local_98 = local_70 * dVar5;
      unique0x10000240 = SUB84(dVar5 * dStack_80,0);
      local_a8 = (undefined1  [8])(dVar5 * local_88);
      unique0x10000244 = (int)((ulong)(dVar5 * dStack_80) >> 0x20);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_b8,"momentum[d]","particle.getMomentum()[d]",
                 (double *)((long)local_58 + lVar2),(double *)(local_a8 + lVar2));
      if (local_b8.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_a8);
        if (local_b0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_b0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x4c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (((local_a8 != (undefined1  [8])0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1))
           && (local_a8 != (undefined1  [8])0x0)) {
          (**(code **)(*(long *)local_a8 + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x18);
    local_b8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         *pica::ParticleTypes::types;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)local_a8,"mass","particle.getMass()",(double *)&local_60,
               (double *)&local_b8);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      if (sStack_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)sStack_a0.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x4d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (((local_b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b8.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_a8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_a8 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           pica::ParticleTypes::types[1];
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)local_a8,"charge","particle.getCharge()",(double *)&local_68,
                 (double *)&local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        if (sStack_a0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)sStack_a0.ptr_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x4e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (((local_b8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           (local_b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_b8.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_a8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_a8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_b8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_3ff0000000000000;
        local_c0.data_ = (AssertHelperData *)&DAT_3ff0000000000000;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)local_a8,"static_cast<FactorType>(1.0)","particle.getFactor()",
                   (double *)&local_b8,(double *)&local_c0);
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (sStack_a0.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)sStack_a0.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                     ,0x4f,pcVar3);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (((local_b8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
             (local_b8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_b8.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_a8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, ConstructorDefaultFactor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(-12.34, 0.2, 423.12e-2);
    MomentumType momentum(3254.23, -123.324, 1.23e5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    ParticleType particle(position, momentum);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
}